

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack23_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x800000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 9;
  *puVar1 = (in[2] - base) * 0x4000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] - base >> 0x12;
  *puVar1 = (in[3] - base) * 0x20 | *puVar1;
  *puVar1 = (in[4] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] - base >> 4;
  *puVar1 = (in[5] - base) * 0x80000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[5] - base >> 0xd;
  *puVar1 = (in[6] - base) * 0x400 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[6] - base >> 0x16;
  *puVar1 = (in[7] - base) * 2 | *puVar1;
  return out + 6;
}

Assistant:

uint32_t * pack23_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;

    return out + 1;
}